

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_optimizations.cpp
# Opt level: O3

LikeString * duckdb::LikeMatchFromRegex(LikeString *__return_storage_ptr__,RE2 *pattern)

{
  pointer pcVar1;
  LikeString *extraout_RAX;
  ulong uVar2;
  Regexp *pRVar3;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar4;
  ulong uVar5;
  undefined2 local_68;
  LikeString *pLStack_60;
  LikeString *local_58;
  size_type sStack_50;
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  undefined8 local_38;
  
  pLStack_60 = (LikeString *)&sStack_50;
  local_58 = (LikeString *)0x0;
  local_48._M_p = (pointer)0x0;
  local_68 = 1;
  sStack_50 = 0;
  pRVar3 = pattern->entire_regexp_;
  uVar5 = (ulong)pRVar3->nsub_;
  if (uVar5 < 2) {
    paVar4 = &pRVar3->field_5;
  }
  else {
    paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar3->field_5).submany_;
  }
  local_40 = &(__return_storage_ptr__->like_string).field_2;
  if (uVar5 == 0) {
    __return_storage_ptr__->exists = true;
    __return_storage_ptr__->escaped = false;
    (__return_storage_ptr__->like_string)._M_dataplus._M_p = (pointer)local_40;
  }
  else {
    local_38 = uVar5 - 1;
    uVar2 = 0;
    do {
      pRVar3 = paVar4[uVar2].subone_;
      switch(pRVar3->op_) {
      case '\x02':
        break;
      case '\x03':
      case '\x04':
        if (uVar2 == 0) {
          ::std::__cxx11::string::append((char *)&pLStack_60);
          pRVar3 = paVar4->subone_;
        }
        GetLikeStringEscaped(__return_storage_ptr__,pRVar3,false);
        if (__return_storage_ptr__->exists != true) {
          if (pLStack_60 == (LikeString *)&sStack_50) {
            return (LikeString *)&sStack_50;
          }
          operator_delete(pLStack_60);
          return extraout_RAX;
        }
        ::std::__cxx11::string::_M_append
                  ((char *)&pLStack_60,(ulong)(__return_storage_ptr__->like_string)._M_dataplus._M_p
                  );
        local_68 = CONCAT11(__return_storage_ptr__->escaped,(undefined1)local_68);
        if (local_38 == uVar2) {
          ::std::__cxx11::string::append((char *)&pLStack_60);
        }
        pcVar1 = (__return_storage_ptr__->like_string)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar1 != local_40) {
          operator_delete(pcVar1);
        }
        break;
      case '\x05':
      case '\x06':
      case '\b':
      case '\t':
      case '\n':
      case '\v':
switchD_00d2538a_caseD_5:
        local_68 = local_68 & 0xff00;
        __return_storage_ptr__->exists = (bool)(undefined1)local_68;
        __return_storage_ptr__->escaped = (bool)local_68._1_1_;
        (__return_storage_ptr__->like_string)._M_dataplus._M_p = (pointer)local_40;
        goto LAB_00d25498;
      case '\a':
        if ((pRVar3->nsub_ != 1) || (((pRVar3->field_5).subone_)->op_ != '\f'))
        goto switchD_00d2538a_caseD_5;
LAB_00d2543c:
        ::std::__cxx11::string::append((char *)&pLStack_60);
        break;
      case '\f':
        if (uVar2 == 0) {
          ::std::__cxx11::string::append((char *)&pLStack_60);
        }
        ::std::__cxx11::string::append((char *)&pLStack_60);
        if (local_38 == uVar2) goto LAB_00d2543c;
        break;
      default:
        if (1 < pRVar3->op_ - 0x12) goto switchD_00d2538a_caseD_5;
      }
      uVar2 = uVar2 + 1;
    } while (uVar5 != uVar2);
    __return_storage_ptr__->exists = (bool)(char)local_68;
    __return_storage_ptr__->escaped = (bool)(char)(local_68 >> 8);
    local_40 = &(__return_storage_ptr__->like_string).field_2;
    (__return_storage_ptr__->like_string)._M_dataplus._M_p = (pointer)local_40;
LAB_00d25498:
    if (pLStack_60 != (LikeString *)&sStack_50) {
      (__return_storage_ptr__->like_string)._M_dataplus._M_p = &pLStack_60->exists;
      (__return_storage_ptr__->like_string).field_2._M_allocated_capacity = sStack_50;
      goto LAB_00d254b7;
    }
  }
  local_40->_M_allocated_capacity = sStack_50;
  *(pointer *)((long)local_40 + 8) = local_48._M_p;
LAB_00d254b7:
  (__return_storage_ptr__->like_string)._M_string_length = (size_type)local_58;
  return local_58;
}

Assistant:

static LikeString LikeMatchFromRegex(duckdb_re2::RE2 &pattern) {
	LikeString ret = LikeString();
	auto num_subs = pattern.Regexp()->nsub();
	auto subs = pattern.Regexp()->sub();
	auto cur_sub_index = 0;
	while (cur_sub_index < num_subs) {
		switch (subs[cur_sub_index]->op()) {
		case duckdb_re2::kRegexpAnyChar:
			if (cur_sub_index == 0) {
				ret.like_string += "%";
			}
			ret.like_string += "_";
			if (cur_sub_index + 1 == num_subs) {
				ret.like_string += "%";
			}
			break;
		case duckdb_re2::kRegexpStar:
			// .* is a Star operator is a anyChar operator as a child.
			// any other child operator would represent a pattern LIKE cannot match.
			if (subs[cur_sub_index]->nsub() == 1 && subs[cur_sub_index]->sub()[0]->op() == duckdb_re2::kRegexpAnyChar) {
				ret.like_string += "%";
				break;
			}
			ret.exists = false;
			return ret;
		case duckdb_re2::kRegexpLiteralString:
		case duckdb_re2::kRegexpLiteral: {
			// if this is the only matching op, we should have directly called
			// GetEscapedLikeString
			D_ASSERT(!(cur_sub_index == 0 && cur_sub_index + 1 == num_subs));
			if (cur_sub_index == 0) {
				ret.like_string += "%";
			}
			// if the kRegexpLiteral or kRegexpLiteralString is the only op to match
			// the string can directly be converted into a contains
			LikeString escaped_like_string = GetLikeStringEscaped(subs[cur_sub_index], false);
			if (!escaped_like_string.exists) {
				return escaped_like_string;
			}
			ret.like_string += escaped_like_string.like_string;
			ret.escaped = escaped_like_string.escaped;
			if (cur_sub_index + 1 == num_subs) {
				ret.like_string += "%";
			}
			break;
		}
		case duckdb_re2::kRegexpEndText:
		case duckdb_re2::kRegexpEmptyMatch:
		case duckdb_re2::kRegexpBeginText: {
			break;
		}
		default:
			// some other regexp op that doesn't have an equivalent to a like string
			// return false;
			ret.exists = false;
			return ret;
		}
		cur_sub_index += 1;
	}
	return ret;
}